

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddPegoutTxOut
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType bitcoin_net_type,
          Pubkey *online_pubkey,Privkey *master_online_key,string *btc_descriptor,
          uint32_t bip32_counter,ByteData *whitelist,NetType elements_net_type,
          Address *btc_derive_address)

{
  bool bVar1;
  uint32_t uVar2;
  Script local_268;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  PegoutKeyData key_data;
  Script script;
  Script locking_script;
  
  core::Script::Script(&script);
  core::PegoutKeyData::PegoutKeyData(&key_data);
  bVar1 = core::Pubkey::IsValid(online_pubkey);
  if (bVar1) {
    bVar1 = core::Privkey::IsValid(master_online_key);
    if (bVar1) {
      core::Address::Address((Address *)&locking_script);
      core::ByteData::ByteData((ByteData *)&local_230);
      core::ConfidentialTransaction::GetPegoutPubkeyData
                ((PegoutKeyData *)&local_268,online_pubkey,master_online_key,btc_descriptor,
                 bip32_counter,whitelist,bitcoin_net_type,(ByteData *)&local_230,elements_net_type,
                 (Address *)&locking_script);
      core::PegoutKeyData::operator=(&key_data,(PegoutKeyData *)&local_268);
      core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)&local_268);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_230);
      core::Address::GetAddress_abi_cxx11_((string *)&local_268,(Address *)&locking_script);
      std::__cxx11::string::~string((string *)&local_268);
      if (local_268.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        core::Address::GetLockingScript(&local_268,(Address *)&locking_script);
        core::Script::operator=(&script,&local_268);
        core::Script::~Script(&local_268);
        if (btc_derive_address != (Address *)0x0) {
          core::Address::operator=(btc_derive_address,(Address *)&locking_script);
        }
      }
      core::Address::~Address((Address *)&locking_script);
      goto LAB_00356b64;
    }
  }
  core::Address::GetLockingScript(&locking_script,btc_address);
  core::Script::operator=(&script,&locking_script);
  core::Script::~Script(&locking_script);
LAB_00356b64:
  core::ScriptUtil::CreatePegoutLogkingScript
            (&locking_script,genesisblock_hash,&script,&key_data.btc_pubkey_bytes,
             &key_data.whitelist_proof);
  uVar2 = core::ConfidentialTransaction::AddTxOut
                    (&this->super_ConfidentialTransaction,value,asset,&locking_script);
  core::Script::~Script(&locking_script);
  core::PegoutKeyData::~PegoutKeyData(&key_data);
  core::Script::~Script(&script);
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType bitcoin_net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && master_online_key.IsValid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, bitcoin_net_type, ByteData(), elements_net_type,
        &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);
  return AddTxOut(value, asset, locking_script);
}